

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDF::getUncompressedObject
          (QPDF *this,QPDFObjectHandle *obj,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *object_stream_data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  QPDFObjectHandle QVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  bVar4 = QPDFObjectHandle::isNull((QPDFObjectHandle *)object_stream_data);
  _Var7._M_pi = extraout_RDX;
  if (!bVar4) {
    iVar5 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)object_stream_data);
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RCX + 8);
    p_Var6 = p_Var8;
    for (p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RCX + 0x10);
        p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (&p_Var1[1]._vptr__Sp_counted_base)
                 [*(int *)&p_Var1[2]._vptr__Sp_counted_base < iVar5]) {
      if (iVar5 <= *(int *)&p_Var1[2]._vptr__Sp_counted_base) {
        p_Var6 = p_Var1;
      }
    }
    _Var7._M_pi = p_Var8;
    if ((p_Var6 != p_Var8) &&
       (_Var7._M_pi = p_Var6, iVar5 < *(int *)&p_Var6[2]._vptr__Sp_counted_base)) {
      _Var7._M_pi = p_Var8;
    }
    if (_Var7._M_pi != p_Var8) {
      iVar5 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)object_stream_data);
      p_Var6 = p_Var8;
      for (p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RCX + 0x10);
          p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (&p_Var1[1]._vptr__Sp_counted_base)
                   [*(int *)&p_Var1[2]._vptr__Sp_counted_base < iVar5]) {
        if (iVar5 <= *(int *)&p_Var1[2]._vptr__Sp_counted_base) {
          p_Var6 = p_Var1;
        }
      }
      if ((p_Var6 != p_Var8) && (*(int *)&p_Var6[2]._vptr__Sp_counted_base <= iVar5)) {
        p_Var8 = p_Var6;
      }
      QVar9 = getObject(this,(int)obj,*(int *)((long)&p_Var8[2]._vptr__Sp_counted_base + 4));
      _Var7._M_pi = QVar9.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_0021bc3b;
    }
  }
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       *(Members **)&(object_stream_data->_M_t)._M_impl;
  _Var2._M_head_impl =
       *(Members **)&(object_stream_data->_M_t)._M_impl.super__Rb_tree_header._M_header;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var2._M_head_impl != (Members *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->log + 8);
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->log + 8);
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
    }
  }
LAB_0021bc3b:
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getUncompressedObject(QPDFObjectHandle& obj, std::map<int, int> const& object_stream_data)
{
    if (obj.isNull() || (object_stream_data.count(obj.getObjectID()) == 0)) {
        return obj;
    } else {
        int repl = (*(object_stream_data.find(obj.getObjectID()))).second;
        return getObject(repl, 0);
    }
}